

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transaction.cpp
# Opt level: O1

void __thiscall
Transaction_RollbackAfterAppendingInt_Test::~Transaction_RollbackAfterAppendingInt_Test
          (Transaction_RollbackAfterAppendingInt_Test *this)

{
  (this->super_Transaction).super_Test._vptr_Test = (_func_int **)&PTR__Transaction_00277410;
  (this->super_Transaction).db_.super_database._vptr_database =
       (_func_int **)&PTR__mock_database_00277450;
  testing::internal::FunctionMocker<pstore::address_(unsigned_long,_unsigned_int)>::~FunctionMocker
            (&(this->super_Transaction).db_.gmock02_allocate_52);
  testing::internal::
  FunctionMocker<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)>::
  ~FunctionMocker(&(this->super_Transaction).db_.gmock14_get_51);
  pstore::database::~database(&(this->super_Transaction).db_.super_database);
  in_memory_store::~in_memory_store(&(this->super_Transaction).store_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x1e0);
  return;
}

Assistant:

TEST_F (Transaction, RollbackAfterAppendingInt) {
    pstore::database db{store_.file ()};
    db.set_vacuum_mode (pstore::database::vacuum_mode::disabled);

    // A quick check of the initial state.
    auto header = this->get_header ();
    ASSERT_EQ (pstore::leader_size, header->footer_pos.load ().absolute ());

    {
        mock_mutex mutex;
        auto transaction = begin (db, std::unique_lock<mock_mutex>{mutex});

        // Write an integer to the store.
        *(transaction.alloc_rw<int> ().first) = 42;

        // Abandon the transaction.
        transaction.rollback ();
    }

    // Header checks
    EXPECT_THAT (pstore::header::file_signature1, ::testing::ContainerEq (header->a.signature1))
        << "File header was missing";
    EXPECT_EQ (pstore::leader_size, header->footer_pos.load ().absolute ())
        << "Expected the file header footer_pos to point to r0 header";

    {
        auto r0footer = reinterpret_cast<pstore::trailer const *> (store_.buffer ().get () +
                                                                   pstore::leader_size);
        EXPECT_THAT (pstore::trailer::default_signature1,
                     ::testing::ContainerEq (r0footer->a.signature1))
            << "Did not find r0 footer signature1";
        EXPECT_EQ (0U, r0footer->a.generation) << "r0 footer generation number must be 0";
        EXPECT_EQ (0U, r0footer->a.size);
        EXPECT_EQ (pstore::typed_address<pstore::trailer>::null (), r0footer->a.prev_generation);
        EXPECT_THAT (pstore::trailer::default_signature2,
                     ::testing::ContainerEq (r0footer->signature2))
            << "Did not find r0 footer signature2";
    }
}